

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_noCompressLiterals(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  undefined1 *in_RDI;
  U32 flSize;
  BYTE *ostart;
  size_t local_8;
  
  uVar1 = (0x1f < in_RCX) + 1 + (uint)(0xfff < in_RCX);
  if (in_RSI < in_RCX + uVar1) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    if (uVar1 == 1) {
      *in_RDI = (char)(in_RCX << 3);
    }
    else if (uVar1 == 2) {
      MEM_writeLE16(in_RDI,0);
    }
    else if (uVar1 == 3) {
      MEM_writeLE32(in_RDI,3);
    }
    memcpy(in_RDI + uVar1,in_RDX,in_RCX);
    local_8 = in_RCX + uVar1;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_noCompressLiterals (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE* const)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    if (srcSize + flSize > dstCapacity) return ERROR(dstSize_tooSmall);

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_basic + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_basic + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_basic + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    memcpy(ostart + flSize, src, srcSize);
    return srcSize + flSize;
}